

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O0

void __thiscall
QAbstractScrollArea::setVerticalScrollBarPolicy(QAbstractScrollArea *this,ScrollBarPolicy policy)

{
  bool bVar1;
  QAbstractScrollAreaPrivate *pQVar2;
  ScrollBarPolicy in_ESI;
  ScrollBarPolicy oldPolicy;
  QAbstractScrollAreaPrivate *d;
  undefined4 in_stack_ffffffffffffffe0;
  ScrollBarPolicy SVar3;
  
  pQVar2 = d_func((QAbstractScrollArea *)0x49797f);
  SVar3 = pQVar2->vbarpolicy;
  pQVar2->vbarpolicy = in_ESI;
  bVar1 = QWidget::isVisible((QWidget *)0x4979ab);
  if (bVar1) {
    QAbstractScrollAreaPrivate::layoutChildren
              ((QAbstractScrollAreaPrivate *)CONCAT44(SVar3,in_stack_ffffffffffffffe0));
  }
  if (SVar3 != pQVar2->vbarpolicy) {
    (**(code **)(*(long *)&(pQVar2->super_QFramePrivate).super_QWidgetPrivate + 0xa8))
              (pQVar2,2,pQVar2->vbarpolicy);
  }
  return;
}

Assistant:

void QAbstractScrollArea::setVerticalScrollBarPolicy(Qt::ScrollBarPolicy policy)
{
    Q_D(QAbstractScrollArea);
    const Qt::ScrollBarPolicy oldPolicy = d->vbarpolicy;
    d->vbarpolicy = policy;
    if (isVisible())
        d->layoutChildren();
    if (oldPolicy != d->vbarpolicy)
        d->scrollBarPolicyChanged(Qt::Vertical, d->vbarpolicy);
}